

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall
ktx::CommandCreate::determineTargetColorSpace
          (CommandCreate *this,ImageInput *in,ImageSpec *target,ColorSpaceInfo *colorSpaceInfo)

{
  bool bVar1;
  khr_df_transfer_e kVar2;
  _khr_df_primaries_e *p_Var3;
  FormatDescriptor *this_00;
  long in_RCX;
  ImageSpec *in_RDX;
  FormatDescriptor *in_RDI;
  khr_df_primaries_e unaff_retaddr;
  CommandCreate *in_stack_00000008;
  SrcColorSpaceInfo *in_stack_000000a0;
  ImageInput *in_stack_000000a8;
  CommandCreate *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  FormatDescriptor *in_stack_ffffffffffffffa0;
  FormatDescriptor *in_stack_ffffffffffffffa8;
  FormatDescriptor *in_stack_ffffffffffffffb0;
  khr_df_transfer_e in_stack_ffffffffffffffbc;
  
  determineSourceColorSpace(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  bVar1 = std::optional<_khr_df_primaries_e>::has_value((optional<_khr_df_primaries_e> *)0x1e1d46);
  if (bVar1) {
    kVar2 = in_stack_ffffffffffffffbc & 0xffffff;
    if (*(int *)(in_RCX + 4) != 0) {
      kVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
    }
    in_stack_ffffffffffffffbc = kVar2;
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') {
      __assert_fail("colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED && \"determineSourceColorSpace failed to check for UNSPECIFIED.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                    ,0xad5,
                    "void ktx::CommandCreate::determineTargetColorSpace(const ImageInput &, ImageSpec &, ColorSpaceInfo &)"
                   );
    }
    in_stack_ffffffffffffffb0 = ImageSpec::format(in_RDX);
    p_Var3 = std::optional<_khr_df_primaries_e>::value
                       ((optional<_khr_df_primaries_e> *)in_stack_ffffffffffffffa0);
    FormatDescriptor::setPrimaries(in_stack_ffffffffffffffb0,*p_Var3);
    ImageSpec::format(in_RDX);
    FormatDescriptor::primaries((FormatDescriptor *)0x1e1dd5);
    createColorPrimaries(in_stack_00000008,unaff_retaddr);
    std::unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>::operator=
              ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
               in_stack_ffffffffffffffa0,
               (unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_>::~unique_ptr
              ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
               in_stack_ffffffffffffffa0);
  }
  else {
    this_00 = ImageSpec::format(in_RDX);
    FormatDescriptor::setPrimaries(this_00,*(khr_df_primaries_e *)(in_RCX + 4));
  }
  bVar1 = std::optional<_khr_df_transfer_e>::has_value((optional<_khr_df_transfer_e> *)0x1e1e38);
  if (bVar1) {
    in_stack_ffffffffffffffa8 = ImageSpec::format(in_RDX);
    std::optional<_khr_df_transfer_e>::value
              ((optional<_khr_df_transfer_e> *)in_stack_ffffffffffffffa0);
    FormatDescriptor::setTransfer(in_RDI,in_stack_ffffffffffffffbc);
  }
  bVar1 = std::optional<_khr_df_transfer_e>::has_value((optional<_khr_df_transfer_e> *)0x1e1e83);
  if (bVar1) {
    in_stack_ffffffffffffffa0 = ImageSpec::format(in_RDX);
    std::optional<_khr_df_transfer_e>::value
              ((optional<_khr_df_transfer_e> *)in_stack_ffffffffffffffa0);
    FormatDescriptor::setTransfer(in_RDI,in_stack_ffffffffffffffbc);
  }
  ImageSpec::format(in_RDX);
  kVar2 = FormatDescriptor::transfer((FormatDescriptor *)0x1e1ecb);
  if (kVar2 == KHR_DF_TRANSFER_LINEAR) {
    std::make_unique<TransferFunctionLinear>();
    std::unique_ptr<TransferFunction_const,std::default_delete<TransferFunction_const>>::operator=
              ((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_> *)
               in_stack_ffffffffffffffb0,
               (unique_ptr<TransferFunctionLinear,_std::default_delete<TransferFunctionLinear>_> *)
               in_stack_ffffffffffffffa8);
    std::unique_ptr<TransferFunctionLinear,_std::default_delete<TransferFunctionLinear>_>::
    ~unique_ptr((unique_ptr<TransferFunctionLinear,_std::default_delete<TransferFunctionLinear>_> *)
                in_stack_ffffffffffffffa0);
  }
  else if (kVar2 == KHR_DF_TRANSFER_SCRGB) {
    std::make_unique<TransferFunctionSRGB>();
    std::unique_ptr<TransferFunction_const,std::default_delete<TransferFunction_const>>::operator=
              ((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_> *)
               in_stack_ffffffffffffffb0,
               (unique_ptr<TransferFunctionSRGB,_std::default_delete<TransferFunctionSRGB>_> *)
               in_stack_ffffffffffffffa8);
    std::unique_ptr<TransferFunctionSRGB,_std::default_delete<TransferFunctionSRGB>_>::~unique_ptr
              ((unique_ptr<TransferFunctionSRGB,_std::default_delete<TransferFunctionSRGB>_> *)
               in_stack_ffffffffffffffa0);
  }
  else {
    std::unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_>::operator=
              ((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_> *)
               in_stack_ffffffffffffffa0,(nullptr_t)CONCAT44(kVar2,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

void CommandCreate::determineTargetColorSpace(const ImageInput& in, ImageSpec& target, ColorSpaceInfo& colorSpaceInfo) {
    // Primaries handling:
    //
    // 1. Use assign-primaries option value, if set.
    // 2. Use primaries info given by plugin.
    // 3. If no primaries info and input is PNG use PNG spec.
    //    recommendation of BT709/sRGB otherwise leave as
    //    UNSPECIFIED.
    // 4. If convert-primaries is specified but no primaries info is
    //    given by the plugin then fail.
    // 5. If convert-primaries is specified and primaries info determined
    //    above is different then set up conversion.

    determineSourceColorSpace(in, colorSpaceInfo.src);

    // Set Primaries

    // If convert-primaries is specified and primaries info determined
    // above is different then set up conversion.
    if (options.convertPrimaries.has_value()) {
        assert(colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED
               && "determineSourceColorSpace failed to check for UNSPECIFIED.");
        target.format().setPrimaries(options.convertPrimaries.value());
        // Okay to set this even if no conversion needed.
        colorSpaceInfo.dst.colorPrimaries = createColorPrimaries(target.format().primaries());
    } else {
        target.format().setPrimaries(colorSpaceInfo.src.usedPrimaries);
    }

    // target transfer is set from the --format value or --assignTF or --convertTF.
    if (options.assignTF.has_value())
        target.format().setTransfer(options.assignTF.value());

    if (options.convertTF.has_value())
        target.format().setTransfer(options.convertTF.value());

    switch (target.format().transfer()) {
    case KHR_DF_TRANSFER_LINEAR:
        colorSpaceInfo.dst.transferFunction = std::make_unique<TransferFunctionLinear>();
        break;
    case KHR_DF_TRANSFER_SRGB:
        colorSpaceInfo.dst.transferFunction = std::make_unique<TransferFunctionSRGB>();
        break;
    default:
        // Lack of will be handled if color transformation attempted.
        colorSpaceInfo.dst.transferFunction = nullptr;
    }
}